

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

void __thiscall mp::QP2Passes::RunPass1(QP2Passes *this)

{
  bool bVar1;
  ExprBase this_00;
  _Bit_reference *this_01;
  QP2Passes *in_RDI;
  iterator term_end;
  iterator term_iter;
  int term_index;
  SumExpr e0;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  *in_stack_ffffffffffffff98;
  type in_stack_ffffffffffffffa4;
  reference in_stack_ffffffffffffffb0;
  size_type __n;
  ExprBase in_stack_ffffffffffffffc8;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_28;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_20;
  int local_14;
  BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45> local_10;
  
  InitPass1((QP2Passes *)in_stack_ffffffffffffffb0._M_p);
  local_10.super_ExprBase.impl_ = (ExprBase)GetTopExpr(in_RDI);
  local_14 = 0;
  local_20.ptr_ =
       (Impl **)BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                ::begin(in_stack_ffffffffffffff98);
  local_28.ptr_ =
       (Impl **)BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                ::end((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                       *)in_RDI);
  while (bVar1 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                 operator!=(&local_28,local_20), bVar1) {
    this_00.impl_ =
         (Impl *)internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                 operator*((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                           in_RDI->visitor_);
    __n = in_stack_ffffffffffffffb0._M_mask;
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_RDI,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffffb0._M_p,
               in_stack_ffffffffffffffa4);
    bVar1 = QP2PassVisitor::Process
                      ((QP2PassVisitor *)this_00.impl_,(Expr)in_stack_ffffffffffffffc8.impl_);
    in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4);
    in_stack_ffffffffffffffb0 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)this_00.impl_,__n);
    this_01 = std::_Bit_reference::operator=
                        ((_Bit_reference *)&stack0xffffffffffffffb0,
                         (bool)((byte)((uint)in_stack_ffffffffffffffa4 >> 0x18) & 1));
    bVar1 = std::_Bit_reference::operator_cast_to_bool(this_01);
    if (bVar1) {
      in_RDI->n_qp_terms_ = in_RDI->n_qp_terms_ + 1;
    }
    internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
              (&local_20);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void QP2Passes::RunPass1() {
  InitPass1();
  auto e0 = GetTopExpr();
  int term_index=0;
  for (auto term_iter=e0.begin(), term_end=e0.end();
       term_end!=term_iter; ++term_iter, ++term_index) {
    if ((is_term_qp_[term_index]             // degree > 2
          = visitor_.Process(*term_iter))) {
      ++n_qp_terms_;
    }
  }
}